

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::FunctionResolver::createAtCall(FunctionResolver *this,CallOrCast *call)

{
  CommaSeparatedList *pCVar1;
  pool_ref<soul::AST::Expression> *ppVar2;
  Expression *args_1;
  Expression *source;
  Expression *pEVar3;
  bool bVar4;
  int iVar5;
  ArraySize AVar6;
  ArrayElementRef *pAVar7;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  bool local_169;
  Type local_168;
  pool_ptr<soul::AST::Expression> local_150;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  pCVar1 = (call->super_CallOrCastBase).arguments.object;
  if ((pCVar1 == (CommaSeparatedList *)0x0) || ((pCVar1->items).numActive != 2)) {
    CompileMessageHelpers::createMessage<>
              (&local_68,syntax,error,"The \'at\' method expects one argument");
    AST::Context::throwError
              (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                context,&local_68,false);
  }
  ppVar2 = (pCVar1->items).items;
  args_1 = ppVar2->object;
  source = ppVar2[1].object;
  local_168.category = primitive;
  local_168.arrayElementCategory = invalid;
  local_168.isRef = false;
  local_168.isConstant = false;
  local_168.primitiveType.type = int64;
  local_168.boundingSize = 0;
  local_168.arrayElementBoundingSize = 0;
  local_168.structure.object = (Structure *)0x0;
  iVar5 = (*(source->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(source);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_168.structure.object);
  if ((char)iVar5 == '\0') {
    local_168.category = primitive;
    local_168.arrayElementCategory = invalid;
    local_168.isRef = false;
    local_168.isConstant = false;
    local_168.primitiveType.type = int32;
    local_168.boundingSize = 0;
    local_168.arrayElementBoundingSize = 0;
    local_168.structure.object = (Structure *)0x0;
    SanityCheckPass::expectSilentCastPossible
              (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                context,&local_168,source);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_168.structure.object);
  }
  if (args_1->kind != value) {
    if (args_1->kind != endpoint) {
      CompileMessageHelpers::createMessage<>(&local_d8,syntax,error,"Expected a value or endpoint");
      AST::Context::throwError
                (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                  context,&local_d8,false);
    }
    iVar5 = (*(args_1->super_Statement).super_ASTObject._vptr_ASTObject[3])(args_1);
    if ((char)iVar5 != '\0') {
      iVar5 = (*(args_1->super_Statement).super_ASTObject._vptr_ASTObject[9])(args_1);
      if ((char)iVar5 != '\0') {
        (*(args_1->super_Statement).super_ASTObject._vptr_ASTObject[8])(&local_168,args_1);
        if (local_168._0_8_ != 0) {
          if (*(long *)(local_168._0_8_ + 0x38) == 0) {
            CompileMessageHelpers::createMessage<>
                      (&local_110,syntax,error,"Cannot resolve the source of the \'at\' method");
            AST::Context::throwError
                      (&(args_1->super_Statement).super_ASTObject.context,&local_110,false);
          }
          pEVar3 = *(Expression **)(*(long *)(local_168._0_8_ + 0x38) + 0x30);
          if (pEVar3 != (Expression *)0x0) {
            local_150.object = pEVar3;
            bVar4 = AST::isResolvedAsConstant(&local_150);
            if (!bVar4) {
              throwInternalCompilerError
                        ("AST::isResolvedAsConstant (endpointArraySize)","createAtCall",0xa48);
            }
            (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_168,pEVar3);
            if (local_168._0_8_ == 0) {
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
            AVar6 = TypeRules::checkAndGetArraySize<soul::AST::Context&>
                              (&(pEVar3->super_Statement).super_ASTObject.context,
                               (Value *)(local_168._0_8_ + 0x30));
            if ((int)AVar6 != 0) goto LAB_001f71a7;
          }
        }
        CompileMessageHelpers::createMessage<>
                  (&local_a0,syntax,error,
                   "The \'at\' method can only be applied to a vector or array");
        AST::Context::throwError
                  (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                    context,&local_a0,false);
      }
    }
    throwInternalCompilerError("AST::isResolvedAsOutput (array)","createAtCall",0xa39);
  }
  (*(args_1->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_168,args_1);
  if ((local_168.category & ~primitive) != vector) {
    CompileMessageHelpers::createMessage<>
              (&local_148,syntax,error,"The \'at\' method can only be applied to a vector or array")
    ;
    AST::Context::throwError
              (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                context,&local_148,false);
  }
  RefCountedPtr<soul::Structure>::decIfNotNull(local_168.structure.object);
LAB_001f71a7:
  local_168.category = invalid;
  local_168.arrayElementCategory = invalid;
  local_168.isRef = false;
  local_168.isConstant = false;
  local_168.primitiveType.type = invalid;
  local_169 = false;
  pAVar7 = PoolAllocator::
           allocate<soul::AST::ArrayElementRef,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&,decltype(nullptr),bool>
                     (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                      &(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject
                       .context,args_1,source,(void **)&local_168,&local_169);
  pAVar7->suppressWrapWarning = true;
  return &pAVar7->super_Expression;
}

Assistant:

AST::Expression& createAtCall (AST::CallOrCast& call)
        {
            if (call.getNumArguments() != 2)
                call.context.throwError (Errors::atMethodTakes1Arg());

            auto& array = call.arguments->items[0].get();
            auto& index = call.arguments->items[1].get();

            if (! index.canSilentlyCastTo (PrimitiveType::int64))
                SanityCheckPass::expectSilentCastPossible (call.context, Type (PrimitiveType::int32), index);

            if (array.kind == AST::ExpressionKind::endpoint)
            {
                SOUL_ASSERT (AST::isResolvedAsOutput (array));
                pool_ptr<AST::Expression> endpointArraySize;

                if (auto endpoint = array.getAsEndpoint())
                {
                    if (endpoint->isUnresolvedChildReference())
                        array.context.throwError (Errors::cannotResolveSourceOfAtMethod());

                    endpointArraySize = endpoint->getDetails().arraySize;
                }

                Type::BoundedIntSize arraySize = 0;

                if (endpointArraySize != nullptr)
                {
                    SOUL_ASSERT (AST::isResolvedAsConstant (endpointArraySize));
                    arraySize = static_cast<Type::BoundedIntSize> (TypeRules::checkAndGetArraySize (endpointArraySize->context,
                                                                                                    endpointArraySize->getAsConstant()->value));
                }

                if (arraySize == 0)
                    call.context.throwError (Errors::wrongTypeForAtMethod());
            }
            else if (array.kind == AST::ExpressionKind::value)
            {
                auto arrayType = array.getResultType();

                if (! arrayType.isArrayOrVector())
                    call.context.throwError (Errors::wrongTypeForAtMethod());
            }
            else
            {
                call.context.throwError (Errors::expectedValueOrEndpoint());
            }

            auto& ref = allocator.allocate<AST::ArrayElementRef> (call.context, array, index, nullptr, false);
            ref.suppressWrapWarning = true;
            return ref;
        }